

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_generate.cc
# Opt level: O3

void __thiscall Trie::build_max(Trie *this,string *prefix)

{
  Trie *this_00;
  pointer pcVar1;
  pointer ppTVar2;
  ulong uVar3;
  __string_type __str;
  string local_58;
  string *local_38;
  
  this->max_count = this->terminus;
  local_38 = (string *)&this->max_string;
  std::__cxx11::string::_M_assign(local_38);
  ppTVar2 = (this->children).super__Vector_base<Trie_*,_std::allocator<Trie_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->children).super__Vector_base<Trie_*,_std::allocator<Trie_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppTVar2) {
    uVar3 = 0;
    do {
      this_00 = ppTVar2[uVar3];
      if (this_00 != (Trie *)0x0) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        pcVar1 = (prefix->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,pcVar1,pcVar1 + prefix->_M_string_length);
        std::__cxx11::string::_M_replace_aux((ulong)&local_58,local_58._M_string_length,0,'\x01');
        build_max(this_00,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        ppTVar2 = (this->children).super__Vector_base<Trie_*,_std::allocator<Trie_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (this->max_count < ppTVar2[uVar3]->max_count) {
          this->max_count = ppTVar2[uVar3]->max_count;
          std::__cxx11::string::_M_assign(local_38);
          ppTVar2 = (this->children).super__Vector_base<Trie_*,_std::allocator<Trie_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)(this->children).
                                   super__Vector_base<Trie_*,_std::allocator<Trie_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)ppTVar2 >> 3));
  }
  return;
}

Assistant:

void build_max(string prefix="")
  { max_count = terminus;
    max_string = prefix;
    for (size_t id=0; id<children.size(); id++)
      if (children[id])
      { char c = action2char(id + 1);
        children[id]->build_max(prefix + c);
        if (children[id]->max_count > max_count)
        { max_count  = children[id]->max_count;
          max_string = children[id]->max_string;
        }
      }
  }